

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O0

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,v3<long> *Val)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  bool local_91;
  anon_union_8_2_2df48d06_for_stref_0 local_90;
  undefined4 local_88;
  anon_union_8_2_2df48d06_for_stref_0 local_80;
  undefined4 local_78;
  anon_union_8_2_2df48d06_for_stref_0 local_70;
  undefined4 local_68;
  int local_5c;
  v3<long> *pvStack_58;
  int I;
  v3<long> *Val_local;
  cstr Opt_local;
  cstr *Args_local;
  int NArgs_local;
  anon_union_8_2_2df48d06_for_stref_0 *local_30;
  anon_union_8_2_2df48d06_for_stref_0 local_28;
  anon_union_8_2_2df48d06_for_stref_0 *local_20;
  anon_union_8_2_2df48d06_for_stref_0 local_18;
  anon_union_8_2_2df48d06_for_stref_0 *local_10;
  
  local_5c = 1;
  pvStack_58 = Val;
  Val_local = (v3<long> *)Opt;
  Opt_local = (cstr)Args;
  Args_local._0_4_ = NArgs;
  while( true ) {
    if ((int)Args_local <= local_5c + 3) {
      return false;
    }
    iVar2 = strncmp(*(char **)(Opt_local + (long)local_5c * 8),(char *)Val_local,0x20);
    if (iVar2 == 0) break;
    local_5c = local_5c + 1;
  }
  _NArgs_local = (anon_union_8_2_2df48d06_for_stref_0)
                 ((anon_union_8_2_2df48d06_for_stref_0 *)(Opt_local + (long)(local_5c + 1) * 8))->
                 Ptr;
  local_30 = &local_70;
  local_70 = _NArgs_local;
  sVar3 = strlen(_NArgs_local);
  local_68 = (undefined4)sVar3;
  bVar1 = ToInt64((stref *)&local_70,(i64 *)pvStack_58);
  local_91 = false;
  if (bVar1) {
    local_28 = (anon_union_8_2_2df48d06_for_stref_0)
               ((anon_union_8_2_2df48d06_for_stref_0 *)(Opt_local + (long)(local_5c + 2) * 8))->Ptr;
    local_20 = &local_80;
    local_80 = local_28;
    sVar3 = strlen(local_28.Ptr);
    local_78 = (undefined4)sVar3;
    bVar1 = ToInt64((stref *)&local_80,&(pvStack_58->field_0).field_0.Y);
    local_91 = false;
    if (bVar1) {
      local_18 = (anon_union_8_2_2df48d06_for_stref_0)
                 ((anon_union_8_2_2df48d06_for_stref_0 *)(Opt_local + (long)(local_5c + 3) * 8))->
                 Ptr;
      local_10 = &local_90;
      local_90 = local_18;
      sVar3 = strlen(local_18.Ptr);
      local_88 = (undefined4)sVar3;
      local_91 = ToInt64((stref *)&local_90,&(pvStack_58->field_0).field_0.Z);
    }
  }
  return local_91;
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, v3<i64>* Val)
{
  for (int I = 1; I + 3 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      return ToInt64(Args[I + 1], &Val->X) && ToInt64(Args[I + 2], &Val->Y) &&
             ToInt64(Args[I + 3], &Val->Z);
    }
  }

  return false;
}